

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<4,_8,_16777232,_true,_embree::avx512::ArrayIntersectorK_1<8,_embree::avx512::TriangleMvMBIntersectorKPluecker<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  RTCFilterFunctionN p_Var1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  ulong uVar14;
  ulong uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  ulong uVar18;
  undefined8 uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  byte bVar38;
  byte bVar39;
  int iVar40;
  AABBNodeMB4D *node1;
  ulong uVar41;
  byte bVar42;
  long lVar43;
  undefined1 (*pauVar44) [32];
  NodeRef root;
  byte bVar45;
  undefined4 uVar46;
  ulong uVar47;
  uint uVar48;
  ulong *puVar49;
  bool bVar50;
  ulong uVar51;
  ulong uVar52;
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 in_ZMM13 [64];
  undefined1 auVar91 [64];
  undefined1 in_ZMM14 [64];
  undefined1 auVar92 [64];
  undefined1 in_ZMM15 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  TravRayK<8,_true> tray;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  Precalculations local_2ac1;
  Geometry *local_2ac0;
  ulong local_2ab8;
  RayQueryContext *local_2ab0;
  undefined4 local_2aa4;
  RayK<8> *local_2aa0;
  BVH *local_2a98;
  Intersectors *local_2a90;
  ulong local_2a88;
  undefined1 local_2a80 [32];
  RTCFilterFunctionNArguments local_2a50;
  undefined1 local_2a20 [32];
  undefined1 local_2a00 [32];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_29e0;
  undefined1 local_2980 [32];
  undefined1 local_2960 [32];
  undefined1 local_2940 [32];
  undefined1 local_2920 [32];
  undefined1 local_2900 [8];
  float fStack_28f8;
  float fStack_28f4;
  float fStack_28f0;
  float fStack_28ec;
  float fStack_28e8;
  undefined4 uStack_28e4;
  undefined1 local_28e0 [8];
  float fStack_28d8;
  float fStack_28d4;
  float fStack_28d0;
  float fStack_28cc;
  float fStack_28c8;
  undefined4 uStack_28c4;
  int local_28c0;
  int iStack_28bc;
  int iStack_28b8;
  int iStack_28b4;
  int iStack_28b0;
  int iStack_28ac;
  int iStack_28a8;
  int iStack_28a4;
  uint local_28a0;
  uint uStack_289c;
  uint uStack_2898;
  uint uStack_2894;
  uint uStack_2890;
  uint uStack_288c;
  uint uStack_2888;
  uint uStack_2884;
  uint local_2880;
  uint uStack_287c;
  uint uStack_2878;
  uint uStack_2874;
  uint uStack_2870;
  uint uStack_286c;
  uint uStack_2868;
  uint uStack_2864;
  undefined1 local_2860 [32];
  undefined1 local_2840 [32];
  undefined1 local_2820 [32];
  undefined1 local_2800 [32];
  undefined1 local_27e0 [32];
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  undefined1 local_2780 [8];
  float fStack_2778;
  float fStack_2774;
  float fStack_2770;
  float fStack_276c;
  float fStack_2768;
  undefined1 local_2760 [8];
  float fStack_2758;
  float fStack_2754;
  float fStack_2750;
  float fStack_274c;
  float fStack_2748;
  undefined8 local_2740;
  undefined8 uStack_2738;
  undefined8 uStack_2730;
  undefined8 uStack_2728;
  undefined8 local_2720;
  undefined8 uStack_2718;
  undefined8 uStack_2710;
  undefined8 uStack_2708;
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  uint local_2660;
  uint uStack_265c;
  uint uStack_2658;
  uint uStack_2654;
  uint uStack_2650;
  uint uStack_264c;
  uint uStack_2648;
  uint uStack_2644;
  uint local_2640;
  uint uStack_263c;
  uint uStack_2638;
  uint uStack_2634;
  uint uStack_2630;
  uint uStack_262c;
  uint uStack_2628;
  uint uStack_2624;
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  
  local_2a98 = (BVH *)This->ptr;
  local_2608 = (local_2a98->root).ptr;
  if (local_2608 != 8) {
    auVar53 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
    auVar83 = ZEXT816(0) << 0x40;
    uVar51 = vcmpps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar83),5);
    uVar41 = vpcmpeqd_avx512vl(auVar53,(undefined1  [32])valid_i->field_0);
    uVar51 = uVar51 & uVar41;
    bVar45 = (byte)uVar51;
    if (bVar45 != 0) {
      local_29e0._0_8_ = *(undefined8 *)ray;
      local_29e0._8_8_ = *(undefined8 *)(ray + 8);
      local_29e0._16_8_ = *(undefined8 *)(ray + 0x10);
      local_29e0._24_8_ = *(undefined8 *)(ray + 0x18);
      local_29e0._32_8_ = *(undefined8 *)(ray + 0x20);
      local_29e0._40_8_ = *(undefined8 *)(ray + 0x28);
      local_29e0._48_8_ = *(undefined8 *)(ray + 0x30);
      local_29e0._56_8_ = *(undefined8 *)(ray + 0x38);
      local_29e0._64_8_ = *(undefined8 *)(ray + 0x40);
      local_29e0._72_8_ = *(undefined8 *)(ray + 0x48);
      local_29e0._80_8_ = *(undefined8 *)(ray + 0x50);
      local_29e0._88_8_ = *(undefined8 *)(ray + 0x58);
      local_2980 = *(undefined1 (*) [32])(ray + 0x80);
      local_2960 = *(undefined1 (*) [32])(ray + 0xa0);
      local_2940 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar53 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar95 = ZEXT3264(auVar53);
      vandps_avx512vl(local_2980,auVar53);
      auVar57._8_4_ = 0x219392ef;
      auVar57._0_8_ = 0x219392ef219392ef;
      auVar57._12_4_ = 0x219392ef;
      auVar57._16_4_ = 0x219392ef;
      auVar57._20_4_ = 0x219392ef;
      auVar57._24_4_ = 0x219392ef;
      auVar57._28_4_ = 0x219392ef;
      uVar41 = vcmpps_avx512vl(auVar53,auVar57,1);
      auVar54 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar96 = ZEXT3264(auVar54);
      auVar55 = vdivps_avx512vl(auVar54,local_2980);
      vandps_avx512vl(local_2960,auVar53);
      uVar47 = vcmpps_avx512vl(auVar55,auVar57,1);
      auVar56 = vdivps_avx512vl(auVar54,local_2960);
      vandps_avx512vl(local_2940,auVar53);
      uVar52 = vcmpps_avx512vl(auVar56,auVar57,1);
      auVar53 = vdivps_avx512vl(auVar54,local_2940);
      bVar50 = (bool)((byte)uVar41 & 1);
      local_2920._0_4_ = (uint)bVar50 * 0x5d5e0b6b | (uint)!bVar50 * auVar55._0_4_;
      bVar50 = (bool)((byte)(uVar41 >> 1) & 1);
      local_2920._4_4_ = (uint)bVar50 * 0x5d5e0b6b | (uint)!bVar50 * auVar55._4_4_;
      bVar50 = (bool)((byte)(uVar41 >> 2) & 1);
      local_2920._8_4_ = (uint)bVar50 * 0x5d5e0b6b | (uint)!bVar50 * auVar55._8_4_;
      bVar50 = (bool)((byte)(uVar41 >> 3) & 1);
      local_2920._12_4_ = (uint)bVar50 * 0x5d5e0b6b | (uint)!bVar50 * auVar55._12_4_;
      bVar50 = (bool)((byte)(uVar41 >> 4) & 1);
      local_2920._16_4_ = (uint)bVar50 * 0x5d5e0b6b | (uint)!bVar50 * auVar55._16_4_;
      bVar50 = (bool)((byte)(uVar41 >> 5) & 1);
      local_2920._20_4_ = (uint)bVar50 * 0x5d5e0b6b | (uint)!bVar50 * auVar55._20_4_;
      bVar50 = (bool)((byte)(uVar41 >> 6) & 1);
      local_2920._24_4_ = (uint)bVar50 * 0x5d5e0b6b | (uint)!bVar50 * auVar55._24_4_;
      bVar50 = SUB81(uVar41 >> 7,0);
      local_2920._28_4_ = (uint)bVar50 * 0x5d5e0b6b | (uint)!bVar50 * auVar55._28_4_;
      bVar50 = (bool)((byte)uVar47 & 1);
      local_2900._0_4_ = (uint)bVar50 * 0x5d5e0b6b | (uint)!bVar50 * auVar56._0_4_;
      bVar50 = (bool)((byte)(uVar47 >> 1) & 1);
      local_2900._4_4_ = (uint)bVar50 * 0x5d5e0b6b | (uint)!bVar50 * auVar56._4_4_;
      bVar50 = (bool)((byte)(uVar47 >> 2) & 1);
      fStack_28f8 = (float)((uint)bVar50 * 0x5d5e0b6b | (uint)!bVar50 * auVar56._8_4_);
      bVar50 = (bool)((byte)(uVar47 >> 3) & 1);
      fStack_28f4 = (float)((uint)bVar50 * 0x5d5e0b6b | (uint)!bVar50 * auVar56._12_4_);
      bVar50 = (bool)((byte)(uVar47 >> 4) & 1);
      fStack_28f0 = (float)((uint)bVar50 * 0x5d5e0b6b | (uint)!bVar50 * auVar56._16_4_);
      bVar50 = (bool)((byte)(uVar47 >> 5) & 1);
      fStack_28ec = (float)((uint)bVar50 * 0x5d5e0b6b | (uint)!bVar50 * auVar56._20_4_);
      bVar50 = (bool)((byte)(uVar47 >> 6) & 1);
      fStack_28e8 = (float)((uint)bVar50 * 0x5d5e0b6b | (uint)!bVar50 * auVar56._24_4_);
      bVar50 = SUB81(uVar47 >> 7,0);
      uStack_28e4 = (uint)bVar50 * 0x5d5e0b6b | (uint)!bVar50 * auVar56._28_4_;
      bVar50 = (bool)((byte)uVar52 & 1);
      local_28e0._0_4_ = (uint)bVar50 * 0x5d5e0b6b | (uint)!bVar50 * auVar53._0_4_;
      bVar50 = (bool)((byte)(uVar52 >> 1) & 1);
      local_28e0._4_4_ = (uint)bVar50 * 0x5d5e0b6b | (uint)!bVar50 * auVar53._4_4_;
      bVar50 = (bool)((byte)(uVar52 >> 2) & 1);
      fStack_28d8 = (float)((uint)bVar50 * 0x5d5e0b6b | (uint)!bVar50 * auVar53._8_4_);
      bVar50 = (bool)((byte)(uVar52 >> 3) & 1);
      fStack_28d4 = (float)((uint)bVar50 * 0x5d5e0b6b | (uint)!bVar50 * auVar53._12_4_);
      bVar50 = (bool)((byte)(uVar52 >> 4) & 1);
      fStack_28d0 = (float)((uint)bVar50 * 0x5d5e0b6b | (uint)!bVar50 * auVar53._16_4_);
      bVar50 = (bool)((byte)(uVar52 >> 5) & 1);
      fStack_28cc = (float)((uint)bVar50 * 0x5d5e0b6b | (uint)!bVar50 * auVar53._20_4_);
      bVar50 = (bool)((byte)(uVar52 >> 6) & 1);
      fStack_28c8 = (float)((uint)bVar50 * 0x5d5e0b6b | (uint)!bVar50 * auVar53._24_4_);
      bVar50 = SUB81(uVar52 >> 7,0);
      uStack_28c4 = (uint)bVar50 * 0x5d5e0b6b | (uint)!bVar50 * auVar53._28_4_;
      uVar41 = vcmpps_avx512vl(local_2920,ZEXT1632(auVar83),1);
      auVar53 = vpbroadcastd_avx512vl(ZEXT416(0x10));
      local_28c0 = (uint)((byte)uVar41 & 1) * auVar53._0_4_;
      iStack_28bc = (uint)((byte)(uVar41 >> 1) & 1) * auVar53._4_4_;
      iStack_28b8 = (uint)((byte)(uVar41 >> 2) & 1) * auVar53._8_4_;
      iStack_28b4 = (uint)((byte)(uVar41 >> 3) & 1) * auVar53._12_4_;
      iStack_28b0 = (uint)((byte)(uVar41 >> 4) & 1) * auVar53._16_4_;
      iStack_28ac = (uint)((byte)(uVar41 >> 5) & 1) * auVar53._20_4_;
      iStack_28a8 = (uint)((byte)(uVar41 >> 6) & 1) * auVar53._24_4_;
      iStack_28a4 = (uint)(byte)(uVar41 >> 7) * auVar53._28_4_;
      auVar54 = ZEXT1632(auVar83);
      uVar41 = vcmpps_avx512vl(_local_2900,auVar54,5);
      auVar53 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      bVar50 = (bool)((byte)uVar41 & 1);
      local_28a0 = (uint)bVar50 * auVar53._0_4_ | (uint)!bVar50 * 0x30;
      bVar50 = (bool)((byte)(uVar41 >> 1) & 1);
      uStack_289c = (uint)bVar50 * auVar53._4_4_ | (uint)!bVar50 * 0x30;
      bVar50 = (bool)((byte)(uVar41 >> 2) & 1);
      uStack_2898 = (uint)bVar50 * auVar53._8_4_ | (uint)!bVar50 * 0x30;
      bVar50 = (bool)((byte)(uVar41 >> 3) & 1);
      uStack_2894 = (uint)bVar50 * auVar53._12_4_ | (uint)!bVar50 * 0x30;
      bVar50 = (bool)((byte)(uVar41 >> 4) & 1);
      uStack_2890 = (uint)bVar50 * auVar53._16_4_ | (uint)!bVar50 * 0x30;
      bVar50 = (bool)((byte)(uVar41 >> 5) & 1);
      uStack_288c = (uint)bVar50 * auVar53._20_4_ | (uint)!bVar50 * 0x30;
      bVar50 = (bool)((byte)(uVar41 >> 6) & 1);
      uStack_2888 = (uint)bVar50 * auVar53._24_4_ | (uint)!bVar50 * 0x30;
      bVar50 = SUB81(uVar41 >> 7,0);
      uStack_2884 = (uint)bVar50 * auVar53._28_4_ | (uint)!bVar50 * 0x30;
      uVar41 = vcmpps_avx512vl(_local_28e0,auVar54,5);
      auVar53 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar50 = (bool)((byte)uVar41 & 1);
      local_2880 = (uint)bVar50 * auVar53._0_4_ | (uint)!bVar50 * 0x50;
      bVar50 = (bool)((byte)(uVar41 >> 1) & 1);
      uStack_287c = (uint)bVar50 * auVar53._4_4_ | (uint)!bVar50 * 0x50;
      bVar50 = (bool)((byte)(uVar41 >> 2) & 1);
      uStack_2878 = (uint)bVar50 * auVar53._8_4_ | (uint)!bVar50 * 0x50;
      bVar50 = (bool)((byte)(uVar41 >> 3) & 1);
      uStack_2874 = (uint)bVar50 * auVar53._12_4_ | (uint)!bVar50 * 0x50;
      bVar50 = (bool)((byte)(uVar41 >> 4) & 1);
      uStack_2870 = (uint)bVar50 * auVar53._16_4_ | (uint)!bVar50 * 0x50;
      bVar50 = (bool)((byte)(uVar41 >> 5) & 1);
      uStack_286c = (uint)bVar50 * auVar53._20_4_ | (uint)!bVar50 * 0x50;
      bVar50 = (bool)((byte)(uVar41 >> 6) & 1);
      uStack_2868 = (uint)bVar50 * auVar53._24_4_ | (uint)!bVar50 * 0x50;
      bVar50 = SUB81(uVar41 >> 7,0);
      uStack_2864 = (uint)bVar50 * auVar53._28_4_ | (uint)!bVar50 * 0x50;
      local_1e80 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar97 = ZEXT3264(local_1e80);
      local_2aa4 = (undefined4)uVar51;
      auVar53 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar54);
      local_2860._0_4_ =
           (uint)(bVar45 & 1) * auVar53._0_4_ | (uint)!(bool)(bVar45 & 1) * local_1e80._0_4_;
      bVar50 = (bool)((byte)(uVar51 >> 1) & 1);
      local_2860._4_4_ = (uint)bVar50 * auVar53._4_4_ | (uint)!bVar50 * local_1e80._4_4_;
      bVar50 = (bool)((byte)(uVar51 >> 2) & 1);
      local_2860._8_4_ = (uint)bVar50 * auVar53._8_4_ | (uint)!bVar50 * local_1e80._8_4_;
      bVar50 = (bool)((byte)(uVar51 >> 3) & 1);
      local_2860._12_4_ = (uint)bVar50 * auVar53._12_4_ | (uint)!bVar50 * local_1e80._12_4_;
      bVar50 = (bool)((byte)(uVar51 >> 4) & 1);
      local_2860._16_4_ = (uint)bVar50 * auVar53._16_4_ | (uint)!bVar50 * local_1e80._16_4_;
      bVar50 = (bool)((byte)(uVar51 >> 5) & 1);
      local_2860._20_4_ = (uint)bVar50 * auVar53._20_4_ | (uint)!bVar50 * local_1e80._20_4_;
      bVar50 = (bool)((byte)(uVar51 >> 6) & 1);
      local_2860._24_4_ = (uint)bVar50 * auVar53._24_4_ | (uint)!bVar50 * local_1e80._24_4_;
      bVar50 = SUB81(uVar51 >> 7,0);
      local_2860._28_4_ = (uint)bVar50 * auVar53._28_4_ | (uint)!bVar50 * local_1e80._28_4_;
      auVar53 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),auVar54);
      local_2840._0_4_ = (uint)(bVar45 & 1) * auVar53._0_4_ | (uint)!(bool)(bVar45 & 1) * -0x800000;
      bVar50 = (bool)((byte)(uVar51 >> 1) & 1);
      local_2840._4_4_ = (uint)bVar50 * auVar53._4_4_ | (uint)!bVar50 * -0x800000;
      bVar50 = (bool)((byte)(uVar51 >> 2) & 1);
      local_2840._8_4_ = (uint)bVar50 * auVar53._8_4_ | (uint)!bVar50 * -0x800000;
      bVar50 = (bool)((byte)(uVar51 >> 3) & 1);
      local_2840._12_4_ = (uint)bVar50 * auVar53._12_4_ | (uint)!bVar50 * -0x800000;
      bVar50 = (bool)((byte)(uVar51 >> 4) & 1);
      local_2840._16_4_ = (uint)bVar50 * auVar53._16_4_ | (uint)!bVar50 * -0x800000;
      bVar50 = (bool)((byte)(uVar51 >> 5) & 1);
      local_2840._20_4_ = (uint)bVar50 * auVar53._20_4_ | (uint)!bVar50 * -0x800000;
      bVar50 = (bool)((byte)(uVar51 >> 6) & 1);
      local_2840._24_4_ = (uint)bVar50 * auVar53._24_4_ | (uint)!bVar50 * -0x800000;
      bVar50 = SUB81(uVar51 >> 7,0);
      local_2840._28_4_ = (uint)bVar50 * auVar53._28_4_ | (uint)!bVar50 * -0x800000;
      bVar45 = ~bVar45;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar51 = 5;
      }
      else {
        uVar51 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                        RTC_RAY_QUERY_FLAG_INCOHERENT) * 3 + 2;
      }
      local_2aa0 = ray + 0x100;
      puVar49 = local_2600;
      local_2610 = 0xfffffffffffffff8;
      pauVar44 = (undefined1 (*) [32])local_1e40;
      local_1e60 = local_2860;
      auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
      auVar98 = ZEXT3264(auVar53);
      auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
      auVar99 = ZEXT3264(auVar53);
      auVar53 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
      auVar100 = ZEXT3264(auVar53);
      local_2ab8 = uVar51;
      local_2ab0 = context;
      local_2a90 = This;
LAB_01f49f6b:
      do {
        do {
          root.ptr = puVar49[-1];
          if (root.ptr == 0xfffffffffffffff8) goto LAB_01f4aaa5;
          puVar49 = puVar49 + -1;
          pauVar44 = pauVar44 + -1;
          auVar53 = *pauVar44;
          auVar94 = ZEXT3264(auVar53);
          uVar41 = vcmpps_avx512vl(auVar53,local_2840,1);
        } while ((char)uVar41 == '\0');
        uVar46 = (undefined4)uVar41;
        if (uVar51 < (uint)POPCOUNT(uVar46)) {
LAB_01f49fae:
          do {
            uVar48 = (uint)root.ptr;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_01f4aaa5;
              uVar16 = vcmpps_avx512vl(auVar94._0_32_,local_2840,9);
              if ((char)uVar16 == '\0') goto LAB_01f49f6b;
              local_2a88 = (ulong)(uVar48 & 0xf) - 8;
              bVar38 = bVar45;
              if (local_2a88 == 0) goto LAB_01f4a96b;
              bVar38 = ~bVar45;
              lVar43 = (root.ptr & 0xfffffffffffffff0) + 0x130;
              uVar41 = 0;
              goto LAB_01f4a222;
            }
            uVar41 = root.ptr & 0xfffffffffffffff0;
            root.ptr = 8;
            lVar43 = -0x10;
            auVar53 = auVar97._0_32_;
            do {
              uVar47 = *(ulong *)(uVar41 + 0x20 + lVar43 * 2);
              if (uVar47 == 8) break;
              uVar46 = *(undefined4 *)(uVar41 + 0x90 + lVar43);
              auVar84._4_4_ = uVar46;
              auVar84._0_4_ = uVar46;
              auVar84._8_4_ = uVar46;
              auVar84._12_4_ = uVar46;
              auVar84._16_4_ = uVar46;
              auVar84._20_4_ = uVar46;
              auVar84._24_4_ = uVar46;
              auVar84._28_4_ = uVar46;
              auVar54 = *(undefined1 (*) [32])(ray + 0xe0);
              uVar46 = *(undefined4 *)(uVar41 + 0x30 + lVar43);
              auVar21._4_4_ = uVar46;
              auVar21._0_4_ = uVar46;
              auVar21._8_4_ = uVar46;
              auVar21._12_4_ = uVar46;
              auVar21._16_4_ = uVar46;
              auVar21._20_4_ = uVar46;
              auVar21._24_4_ = uVar46;
              auVar21._28_4_ = uVar46;
              auVar55 = vfmadd213ps_avx512vl(auVar84,auVar54,auVar21);
              uVar46 = *(undefined4 *)(uVar41 + 0xb0 + lVar43);
              auVar85._4_4_ = uVar46;
              auVar85._0_4_ = uVar46;
              auVar85._8_4_ = uVar46;
              auVar85._12_4_ = uVar46;
              auVar85._16_4_ = uVar46;
              auVar85._20_4_ = uVar46;
              auVar85._24_4_ = uVar46;
              auVar85._28_4_ = uVar46;
              uVar46 = *(undefined4 *)(uVar41 + 0x50 + lVar43);
              auVar22._4_4_ = uVar46;
              auVar22._0_4_ = uVar46;
              auVar22._8_4_ = uVar46;
              auVar22._12_4_ = uVar46;
              auVar22._16_4_ = uVar46;
              auVar22._20_4_ = uVar46;
              auVar22._24_4_ = uVar46;
              auVar22._28_4_ = uVar46;
              auVar56 = vfmadd213ps_avx512vl(auVar85,auVar54,auVar22);
              uVar46 = *(undefined4 *)(uVar41 + 0xd0 + lVar43);
              auVar86._4_4_ = uVar46;
              auVar86._0_4_ = uVar46;
              auVar86._8_4_ = uVar46;
              auVar86._12_4_ = uVar46;
              auVar86._16_4_ = uVar46;
              auVar86._20_4_ = uVar46;
              auVar86._24_4_ = uVar46;
              auVar86._28_4_ = uVar46;
              uVar46 = *(undefined4 *)(uVar41 + 0x70 + lVar43);
              auVar23._4_4_ = uVar46;
              auVar23._0_4_ = uVar46;
              auVar23._8_4_ = uVar46;
              auVar23._12_4_ = uVar46;
              auVar23._16_4_ = uVar46;
              auVar23._20_4_ = uVar46;
              auVar23._24_4_ = uVar46;
              auVar23._28_4_ = uVar46;
              auVar57 = vfmadd213ps_avx512vl(auVar86,auVar54,auVar23);
              uVar46 = *(undefined4 *)(uVar41 + 0xa0 + lVar43);
              auVar87._4_4_ = uVar46;
              auVar87._0_4_ = uVar46;
              auVar87._8_4_ = uVar46;
              auVar87._12_4_ = uVar46;
              auVar87._16_4_ = uVar46;
              auVar87._20_4_ = uVar46;
              auVar87._24_4_ = uVar46;
              auVar87._28_4_ = uVar46;
              uVar46 = *(undefined4 *)(uVar41 + 0x40 + lVar43);
              auVar24._4_4_ = uVar46;
              auVar24._0_4_ = uVar46;
              auVar24._8_4_ = uVar46;
              auVar24._12_4_ = uVar46;
              auVar24._16_4_ = uVar46;
              auVar24._20_4_ = uVar46;
              auVar24._24_4_ = uVar46;
              auVar24._28_4_ = uVar46;
              auVar58 = vfmadd213ps_avx512vl(auVar87,auVar54,auVar24);
              uVar46 = *(undefined4 *)(uVar41 + 0xc0 + lVar43);
              auVar89._4_4_ = uVar46;
              auVar89._0_4_ = uVar46;
              auVar89._8_4_ = uVar46;
              auVar89._12_4_ = uVar46;
              auVar89._16_4_ = uVar46;
              auVar89._20_4_ = uVar46;
              auVar89._24_4_ = uVar46;
              auVar89._28_4_ = uVar46;
              uVar46 = *(undefined4 *)(uVar41 + 0x60 + lVar43);
              auVar25._4_4_ = uVar46;
              auVar25._0_4_ = uVar46;
              auVar25._8_4_ = uVar46;
              auVar25._12_4_ = uVar46;
              auVar25._16_4_ = uVar46;
              auVar25._20_4_ = uVar46;
              auVar25._24_4_ = uVar46;
              auVar25._28_4_ = uVar46;
              auVar59 = vfmadd213ps_avx512vl(auVar89,auVar54,auVar25);
              uVar46 = *(undefined4 *)(uVar41 + 0xe0 + lVar43);
              auVar90._4_4_ = uVar46;
              auVar90._0_4_ = uVar46;
              auVar90._8_4_ = uVar46;
              auVar90._12_4_ = uVar46;
              auVar90._16_4_ = uVar46;
              auVar90._20_4_ = uVar46;
              auVar90._24_4_ = uVar46;
              auVar90._28_4_ = uVar46;
              uVar46 = *(undefined4 *)(uVar41 + 0x80 + lVar43);
              auVar26._4_4_ = uVar46;
              auVar26._0_4_ = uVar46;
              auVar26._8_4_ = uVar46;
              auVar26._12_4_ = uVar46;
              auVar26._16_4_ = uVar46;
              auVar26._20_4_ = uVar46;
              auVar26._24_4_ = uVar46;
              auVar26._28_4_ = uVar46;
              auVar60 = vfmadd213ps_avx512vl(auVar90,auVar54,auVar26);
              auVar35._8_8_ = local_29e0._8_8_;
              auVar35._0_8_ = local_29e0._0_8_;
              auVar35._16_8_ = local_29e0._16_8_;
              auVar35._24_8_ = local_29e0._24_8_;
              auVar36._8_8_ = local_29e0._40_8_;
              auVar36._0_8_ = local_29e0._32_8_;
              auVar36._16_8_ = local_29e0._48_8_;
              auVar36._24_8_ = local_29e0._56_8_;
              auVar37._8_8_ = local_29e0._72_8_;
              auVar37._0_8_ = local_29e0._64_8_;
              auVar37._16_8_ = local_29e0._80_8_;
              auVar37._24_8_ = local_29e0._88_8_;
              auVar55 = vsubps_avx(auVar55,auVar35);
              auVar91._0_4_ = local_2920._0_4_ * auVar55._0_4_;
              auVar91._4_4_ = local_2920._4_4_ * auVar55._4_4_;
              auVar91._8_4_ = local_2920._8_4_ * auVar55._8_4_;
              auVar91._12_4_ = local_2920._12_4_ * auVar55._12_4_;
              auVar91._16_4_ = local_2920._16_4_ * auVar55._16_4_;
              auVar91._20_4_ = local_2920._20_4_ * auVar55._20_4_;
              auVar91._28_36_ = in_ZMM13._28_36_;
              auVar91._24_4_ = local_2920._24_4_ * auVar55._24_4_;
              auVar68 = auVar91._0_32_;
              in_ZMM13 = ZEXT3264(auVar68);
              auVar55 = vsubps_avx(auVar56,auVar36);
              auVar92._0_4_ = auVar55._0_4_ * (float)local_2900._0_4_;
              auVar92._4_4_ = auVar55._4_4_ * (float)local_2900._4_4_;
              auVar92._8_4_ = auVar55._8_4_ * fStack_28f8;
              auVar92._12_4_ = auVar55._12_4_ * fStack_28f4;
              auVar92._16_4_ = auVar55._16_4_ * fStack_28f0;
              auVar92._20_4_ = auVar55._20_4_ * fStack_28ec;
              auVar92._28_36_ = in_ZMM14._28_36_;
              auVar92._24_4_ = auVar55._24_4_ * fStack_28e8;
              auVar69 = auVar92._0_32_;
              in_ZMM14 = ZEXT3264(auVar69);
              auVar55 = vsubps_avx(auVar57,auVar37);
              auVar93._0_4_ = auVar55._0_4_ * (float)local_28e0._0_4_;
              auVar93._4_4_ = auVar55._4_4_ * (float)local_28e0._4_4_;
              auVar93._8_4_ = auVar55._8_4_ * fStack_28d8;
              auVar93._12_4_ = auVar55._12_4_ * fStack_28d4;
              auVar93._16_4_ = auVar55._16_4_ * fStack_28d0;
              auVar93._20_4_ = auVar55._20_4_ * fStack_28cc;
              auVar93._28_36_ = in_ZMM15._28_36_;
              auVar93._24_4_ = auVar55._24_4_ * fStack_28c8;
              auVar70 = auVar93._0_32_;
              in_ZMM15 = ZEXT3264(auVar70);
              auVar55 = vsubps_avx(auVar58,auVar35);
              auVar30._4_4_ = local_2920._4_4_ * auVar55._4_4_;
              auVar30._0_4_ = local_2920._0_4_ * auVar55._0_4_;
              auVar30._8_4_ = local_2920._8_4_ * auVar55._8_4_;
              auVar30._12_4_ = local_2920._12_4_ * auVar55._12_4_;
              auVar30._16_4_ = local_2920._16_4_ * auVar55._16_4_;
              auVar30._20_4_ = local_2920._20_4_ * auVar55._20_4_;
              auVar30._24_4_ = local_2920._24_4_ * auVar55._24_4_;
              auVar30._28_4_ = auVar58._28_4_;
              auVar55 = vsubps_avx(auVar59,auVar36);
              auVar31._4_4_ = auVar55._4_4_ * (float)local_2900._4_4_;
              auVar31._0_4_ = auVar55._0_4_ * (float)local_2900._0_4_;
              auVar31._8_4_ = auVar55._8_4_ * fStack_28f8;
              auVar31._12_4_ = auVar55._12_4_ * fStack_28f4;
              auVar31._16_4_ = auVar55._16_4_ * fStack_28f0;
              auVar31._20_4_ = auVar55._20_4_ * fStack_28ec;
              auVar31._24_4_ = auVar55._24_4_ * fStack_28e8;
              auVar31._28_4_ = uStack_28e4;
              auVar55 = vsubps_avx(auVar60,auVar37);
              auVar32._4_4_ = auVar55._4_4_ * (float)local_28e0._4_4_;
              auVar32._0_4_ = auVar55._0_4_ * (float)local_28e0._0_4_;
              auVar32._8_4_ = auVar55._8_4_ * fStack_28d8;
              auVar32._12_4_ = auVar55._12_4_ * fStack_28d4;
              auVar32._16_4_ = auVar55._16_4_ * fStack_28d0;
              auVar32._20_4_ = auVar55._20_4_ * fStack_28cc;
              auVar32._24_4_ = auVar55._24_4_ * fStack_28c8;
              auVar32._28_4_ = uStack_28c4;
              auVar55 = vpminsd_avx2(auVar68,auVar30);
              auVar56 = vpminsd_avx2(auVar69,auVar31);
              auVar55 = vpmaxsd_avx2(auVar55,auVar56);
              auVar56 = vpminsd_avx2(auVar70,auVar32);
              auVar55 = vpmaxsd_avx2(auVar55,auVar56);
              auVar57 = vmulps_avx512vl(auVar55,auVar98._0_32_);
              auVar55 = vpmaxsd_avx2(auVar68,auVar30);
              auVar56 = vpmaxsd_avx2(auVar69,auVar31);
              auVar56 = vpminsd_avx2(auVar55,auVar56);
              auVar55 = vpmaxsd_avx2(auVar70,auVar32);
              auVar55 = vpminsd_avx2(auVar56,auVar55);
              auVar56 = vmulps_avx512vl(auVar55,auVar99._0_32_);
              auVar55 = vpmaxsd_avx2(auVar57,local_2860);
              auVar56 = vpminsd_avx2(auVar56,local_2840);
              uVar52 = vcmpps_avx512vl(auVar55,auVar56,2);
              if ((uVar48 & 7) == 6) {
                uVar46 = *(undefined4 *)(uVar41 + 0xf0 + lVar43);
                auVar27._4_4_ = uVar46;
                auVar27._0_4_ = uVar46;
                auVar27._8_4_ = uVar46;
                auVar27._12_4_ = uVar46;
                auVar27._16_4_ = uVar46;
                auVar27._20_4_ = uVar46;
                auVar27._24_4_ = uVar46;
                auVar27._28_4_ = uVar46;
                uVar14 = vcmpps_avx512vl(auVar54,auVar27,0xd);
                uVar46 = *(undefined4 *)(uVar41 + 0x100 + lVar43);
                auVar28._4_4_ = uVar46;
                auVar28._0_4_ = uVar46;
                auVar28._8_4_ = uVar46;
                auVar28._12_4_ = uVar46;
                auVar28._16_4_ = uVar46;
                auVar28._20_4_ = uVar46;
                auVar28._24_4_ = uVar46;
                auVar28._28_4_ = uVar46;
                uVar15 = vcmpps_avx512vl(auVar54,auVar28,1);
                uVar52 = uVar52 & uVar14 & uVar15;
              }
              uVar14 = vcmpps_avx512vl(local_2840,auVar94._0_32_,6);
              uVar52 = uVar52 & uVar14;
              uVar14 = root.ptr;
              auVar61 = auVar53;
              if ((byte)uVar52 != 0) {
                auVar55 = vblendmps_avx512vl(auVar97._0_32_,auVar57);
                bVar50 = (bool)((byte)uVar52 & 1);
                auVar61._0_4_ = (uint)bVar50 * auVar55._0_4_ | (uint)!bVar50 * auVar54._0_4_;
                bVar50 = (bool)((byte)(uVar52 >> 1) & 1);
                auVar61._4_4_ = (uint)bVar50 * auVar55._4_4_ | (uint)!bVar50 * auVar54._4_4_;
                bVar50 = (bool)((byte)(uVar52 >> 2) & 1);
                auVar61._8_4_ = (uint)bVar50 * auVar55._8_4_ | (uint)!bVar50 * auVar54._8_4_;
                bVar50 = (bool)((byte)(uVar52 >> 3) & 1);
                auVar61._12_4_ = (uint)bVar50 * auVar55._12_4_ | (uint)!bVar50 * auVar54._12_4_;
                bVar50 = (bool)((byte)(uVar52 >> 4) & 1);
                auVar61._16_4_ = (uint)bVar50 * auVar55._16_4_ | (uint)!bVar50 * auVar54._16_4_;
                bVar50 = (bool)((byte)(uVar52 >> 5) & 1);
                auVar61._20_4_ = (uint)bVar50 * auVar55._20_4_ | (uint)!bVar50 * auVar54._20_4_;
                bVar50 = (bool)((byte)(uVar52 >> 6) & 1);
                auVar61._24_4_ = (uint)bVar50 * auVar55._24_4_ | (uint)!bVar50 * auVar54._24_4_;
                bVar50 = SUB81(uVar52 >> 7,0);
                auVar61._28_4_ = (uint)bVar50 * auVar55._28_4_ | (uint)!bVar50 * auVar54._28_4_;
                uVar14 = uVar47;
                if (root.ptr != 8) {
                  *puVar49 = root.ptr;
                  puVar49 = puVar49 + 1;
                  *pauVar44 = auVar53;
                  pauVar44 = pauVar44 + 1;
                }
              }
              auVar53 = auVar61;
              root.ptr = uVar14;
              lVar43 = lVar43 + 4;
            } while (lVar43 != 0);
            iVar40 = 4;
            if (root.ptr == 8) goto LAB_01f4a1c8;
            uVar16 = vcmpps_avx512vl(auVar53,local_2840,9);
            auVar94 = ZEXT3264(auVar53);
          } while ((byte)uVar51 < (byte)POPCOUNT((int)uVar16));
          *puVar49 = root.ptr;
          puVar49 = puVar49 + 1;
          *pauVar44 = auVar53;
          pauVar44 = pauVar44 + 1;
        }
        else {
          do {
            local_2a80 = auVar53;
            local_2ac0 = (Geometry *)0x0;
            for (uVar51 = uVar41; (uVar51 & 1) == 0; uVar51 = uVar51 >> 1 | 0x8000000000000000) {
              local_2ac0 = (Geometry *)((long)local_2ac0 + 1);
            }
            in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
            in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
            in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
            bVar50 = occluded1(local_2a90,local_2a98,root,(size_t)local_2ac0,&local_2ac1,ray,
                               (TravRayK<8,_true> *)&local_29e0.field_0,context);
            bVar38 = (byte)(1 << ((uint)local_2ac0 & 0x1f));
            if (!bVar50) {
              bVar38 = 0;
            }
            bVar45 = bVar45 | bVar38;
            uVar41 = uVar41 - 1 & uVar41;
            context = local_2ab0;
            auVar53 = local_2a80;
          } while (uVar41 != 0);
          if (bVar45 == 0xff) {
            iVar40 = 3;
          }
          else {
            auVar53 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            local_2840._0_4_ =
                 (uint)(bVar45 & 1) * auVar53._0_4_ | (uint)!(bool)(bVar45 & 1) * local_2840._0_4_;
            bVar50 = (bool)(bVar45 >> 1 & 1);
            local_2840._4_4_ = (uint)bVar50 * auVar53._4_4_ | (uint)!bVar50 * local_2840._4_4_;
            bVar50 = (bool)(bVar45 >> 2 & 1);
            local_2840._8_4_ = (uint)bVar50 * auVar53._8_4_ | (uint)!bVar50 * local_2840._8_4_;
            bVar50 = (bool)(bVar45 >> 3 & 1);
            local_2840._12_4_ = (uint)bVar50 * auVar53._12_4_ | (uint)!bVar50 * local_2840._12_4_;
            bVar50 = (bool)(bVar45 >> 4 & 1);
            local_2840._16_4_ = (uint)bVar50 * auVar53._16_4_ | (uint)!bVar50 * local_2840._16_4_;
            bVar50 = (bool)(bVar45 >> 5 & 1);
            local_2840._20_4_ = (uint)bVar50 * auVar53._20_4_ | (uint)!bVar50 * local_2840._20_4_;
            bVar50 = (bool)(bVar45 >> 6 & 1);
            local_2840._24_4_ = (uint)bVar50 * auVar53._24_4_ | (uint)!bVar50 * local_2840._24_4_;
            local_2840._28_4_ =
                 (uint)(bVar45 >> 7) * auVar53._28_4_ |
                 (uint)!(bool)(bVar45 >> 7) * local_2840._28_4_;
            iVar40 = 2;
          }
          auVar53 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar97 = ZEXT3264(auVar53);
          auVar94 = ZEXT3264(local_2a80);
          auVar53 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar95 = ZEXT3264(auVar53);
          auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar96 = ZEXT3264(auVar53);
          auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
          auVar98 = ZEXT3264(auVar53);
          auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
          auVar99 = ZEXT3264(auVar53);
          auVar53 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
          auVar100 = ZEXT3264(auVar53);
          uVar51 = local_2ab8;
          if ((uint)local_2ab8 < (uint)POPCOUNT(uVar46)) goto LAB_01f49fae;
        }
LAB_01f4a1c8:
      } while ((iVar40 == 4) || (iVar40 == 2));
LAB_01f4aaa5:
      bVar45 = bVar45 & (byte)local_2aa4;
      bVar50 = (bool)(bVar45 >> 1 & 1);
      bVar2 = (bool)(bVar45 >> 2 & 1);
      bVar3 = (bool)(bVar45 >> 3 & 1);
      bVar4 = (bool)(bVar45 >> 4 & 1);
      bVar5 = (bool)(bVar45 >> 5 & 1);
      bVar6 = (bool)(bVar45 >> 6 & 1);
      *(uint *)local_2aa0 =
           (uint)(bVar45 & 1) * -0x800000 | (uint)!(bool)(bVar45 & 1) * *(int *)local_2aa0;
      *(uint *)(local_2aa0 + 4) =
           (uint)bVar50 * -0x800000 | (uint)!bVar50 * *(int *)(local_2aa0 + 4);
      *(uint *)(local_2aa0 + 8) = (uint)bVar2 * -0x800000 | (uint)!bVar2 * *(int *)(local_2aa0 + 8);
      *(uint *)(local_2aa0 + 0xc) =
           (uint)bVar3 * -0x800000 | (uint)!bVar3 * *(int *)(local_2aa0 + 0xc);
      *(uint *)(local_2aa0 + 0x10) =
           (uint)bVar4 * -0x800000 | (uint)!bVar4 * *(int *)(local_2aa0 + 0x10);
      *(uint *)(local_2aa0 + 0x14) =
           (uint)bVar5 * -0x800000 | (uint)!bVar5 * *(int *)(local_2aa0 + 0x14);
      *(uint *)(local_2aa0 + 0x18) =
           (uint)bVar6 * -0x800000 | (uint)!bVar6 * *(int *)(local_2aa0 + 0x18);
      *(uint *)(local_2aa0 + 0x1c) =
           (uint)(bVar45 >> 7) * -0x800000 |
           (uint)!(bool)(bVar45 >> 7) * *(int *)(local_2aa0 + 0x1c);
    }
  }
  return;
  while( true ) {
    uVar41 = uVar41 + 1;
    lVar43 = lVar43 + 0x140;
    if (local_2a88 <= uVar41) break;
LAB_01f4a222:
    uVar47 = 0;
    bVar39 = bVar38;
    while (uVar52 = (ulong)*(uint *)(lVar43 + -0x10 + uVar47 * 4), uVar52 != 0xffffffff) {
      auVar53 = *(undefined1 (*) [32])(ray + 0xe0);
      uVar46 = *(undefined4 *)(lVar43 + -0xa0 + uVar47 * 4);
      auVar63._4_4_ = uVar46;
      auVar63._0_4_ = uVar46;
      auVar63._8_4_ = uVar46;
      auVar63._12_4_ = uVar46;
      auVar63._16_4_ = uVar46;
      auVar63._20_4_ = uVar46;
      auVar63._24_4_ = uVar46;
      auVar63._28_4_ = uVar46;
      uVar46 = *(undefined4 *)(lVar43 + -0x90 + uVar47 * 4);
      auVar64._4_4_ = uVar46;
      auVar64._0_4_ = uVar46;
      auVar64._8_4_ = uVar46;
      auVar64._12_4_ = uVar46;
      auVar64._16_4_ = uVar46;
      auVar64._20_4_ = uVar46;
      auVar64._24_4_ = uVar46;
      auVar64._28_4_ = uVar46;
      uVar46 = *(undefined4 *)(lVar43 + -0x80 + uVar47 * 4);
      auVar65._4_4_ = uVar46;
      auVar65._0_4_ = uVar46;
      auVar65._8_4_ = uVar46;
      auVar65._12_4_ = uVar46;
      auVar65._16_4_ = uVar46;
      auVar65._20_4_ = uVar46;
      auVar65._24_4_ = uVar46;
      auVar65._28_4_ = uVar46;
      uVar46 = *(undefined4 *)(lVar43 + -0x130 + uVar47 * 4);
      auVar54._4_4_ = uVar46;
      auVar54._0_4_ = uVar46;
      auVar54._8_4_ = uVar46;
      auVar54._12_4_ = uVar46;
      auVar54._16_4_ = uVar46;
      auVar54._20_4_ = uVar46;
      auVar54._24_4_ = uVar46;
      auVar54._28_4_ = uVar46;
      auVar62 = vfmadd213ps_avx512vl(auVar63,auVar53,auVar54);
      uVar46 = *(undefined4 *)(lVar43 + -0x120 + uVar47 * 4);
      auVar55._4_4_ = uVar46;
      auVar55._0_4_ = uVar46;
      auVar55._8_4_ = uVar46;
      auVar55._12_4_ = uVar46;
      auVar55._16_4_ = uVar46;
      auVar55._20_4_ = uVar46;
      auVar55._24_4_ = uVar46;
      auVar55._28_4_ = uVar46;
      auVar63 = vfmadd213ps_avx512vl(auVar64,auVar53,auVar55);
      uVar46 = *(undefined4 *)(lVar43 + -0x110 + uVar47 * 4);
      auVar56._4_4_ = uVar46;
      auVar56._0_4_ = uVar46;
      auVar56._8_4_ = uVar46;
      auVar56._12_4_ = uVar46;
      auVar56._16_4_ = uVar46;
      auVar56._20_4_ = uVar46;
      auVar56._24_4_ = uVar46;
      auVar56._28_4_ = uVar46;
      auVar64 = vfmadd213ps_avx512vl(auVar65,auVar53,auVar56);
      uVar46 = *(undefined4 *)(lVar43 + -0x70 + uVar47 * 4);
      auVar66._4_4_ = uVar46;
      auVar66._0_4_ = uVar46;
      auVar66._8_4_ = uVar46;
      auVar66._12_4_ = uVar46;
      auVar66._16_4_ = uVar46;
      auVar66._20_4_ = uVar46;
      auVar66._24_4_ = uVar46;
      auVar66._28_4_ = uVar46;
      uVar46 = *(undefined4 *)(lVar43 + -0x60 + uVar47 * 4);
      auVar67._4_4_ = uVar46;
      auVar67._0_4_ = uVar46;
      auVar67._8_4_ = uVar46;
      auVar67._12_4_ = uVar46;
      auVar67._16_4_ = uVar46;
      auVar67._20_4_ = uVar46;
      auVar67._24_4_ = uVar46;
      auVar67._28_4_ = uVar46;
      uVar46 = *(undefined4 *)(lVar43 + -0x50 + uVar47 * 4);
      auVar71._4_4_ = uVar46;
      auVar71._0_4_ = uVar46;
      auVar71._8_4_ = uVar46;
      auVar71._12_4_ = uVar46;
      auVar71._16_4_ = uVar46;
      auVar71._20_4_ = uVar46;
      auVar71._24_4_ = uVar46;
      auVar71._28_4_ = uVar46;
      uVar46 = *(undefined4 *)(lVar43 + -0x100 + uVar47 * 4);
      auVar58._4_4_ = uVar46;
      auVar58._0_4_ = uVar46;
      auVar58._8_4_ = uVar46;
      auVar58._12_4_ = uVar46;
      auVar58._16_4_ = uVar46;
      auVar58._20_4_ = uVar46;
      auVar58._24_4_ = uVar46;
      auVar58._28_4_ = uVar46;
      auVar65 = vfmadd213ps_avx512vl(auVar66,auVar53,auVar58);
      uVar46 = *(undefined4 *)(lVar43 + -0xf0 + uVar47 * 4);
      auVar59._4_4_ = uVar46;
      auVar59._0_4_ = uVar46;
      auVar59._8_4_ = uVar46;
      auVar59._12_4_ = uVar46;
      auVar59._16_4_ = uVar46;
      auVar59._20_4_ = uVar46;
      auVar59._24_4_ = uVar46;
      auVar59._28_4_ = uVar46;
      auVar66 = vfmadd213ps_avx512vl(auVar67,auVar53,auVar59);
      uVar46 = *(undefined4 *)(lVar43 + -0xe0 + uVar47 * 4);
      auVar60._4_4_ = uVar46;
      auVar60._0_4_ = uVar46;
      auVar60._8_4_ = uVar46;
      auVar60._12_4_ = uVar46;
      auVar60._16_4_ = uVar46;
      auVar60._20_4_ = uVar46;
      auVar60._24_4_ = uVar46;
      auVar60._28_4_ = uVar46;
      auVar67 = vfmadd213ps_avx512vl(auVar71,auVar53,auVar60);
      uVar46 = *(undefined4 *)(lVar43 + -0x40 + uVar47 * 4);
      auVar72._4_4_ = uVar46;
      auVar72._0_4_ = uVar46;
      auVar72._8_4_ = uVar46;
      auVar72._12_4_ = uVar46;
      auVar72._16_4_ = uVar46;
      auVar72._20_4_ = uVar46;
      auVar72._24_4_ = uVar46;
      auVar72._28_4_ = uVar46;
      uVar46 = *(undefined4 *)(lVar43 + -0x30 + uVar47 * 4);
      auVar73._4_4_ = uVar46;
      auVar73._0_4_ = uVar46;
      auVar73._8_4_ = uVar46;
      auVar73._12_4_ = uVar46;
      auVar73._16_4_ = uVar46;
      auVar73._20_4_ = uVar46;
      auVar73._24_4_ = uVar46;
      auVar73._28_4_ = uVar46;
      uVar46 = *(undefined4 *)(lVar43 + -0x20 + uVar47 * 4);
      auVar74._4_4_ = uVar46;
      auVar74._0_4_ = uVar46;
      auVar74._8_4_ = uVar46;
      auVar74._12_4_ = uVar46;
      auVar74._16_4_ = uVar46;
      auVar74._20_4_ = uVar46;
      auVar74._24_4_ = uVar46;
      auVar74._28_4_ = uVar46;
      uVar46 = *(undefined4 *)(lVar43 + -0xd0 + uVar47 * 4);
      auVar68._4_4_ = uVar46;
      auVar68._0_4_ = uVar46;
      auVar68._8_4_ = uVar46;
      auVar68._12_4_ = uVar46;
      auVar68._16_4_ = uVar46;
      auVar68._20_4_ = uVar46;
      auVar68._24_4_ = uVar46;
      auVar68._28_4_ = uVar46;
      auVar68 = vfmadd213ps_avx512vl(auVar72,auVar53,auVar68);
      uVar46 = *(undefined4 *)(lVar43 + -0xc0 + uVar47 * 4);
      auVar69._4_4_ = uVar46;
      auVar69._0_4_ = uVar46;
      auVar69._8_4_ = uVar46;
      auVar69._12_4_ = uVar46;
      auVar69._16_4_ = uVar46;
      auVar69._20_4_ = uVar46;
      auVar69._24_4_ = uVar46;
      auVar69._28_4_ = uVar46;
      auVar69 = vfmadd213ps_avx512vl(auVar73,auVar53,auVar69);
      uVar46 = *(undefined4 *)(lVar43 + -0xb0 + uVar47 * 4);
      auVar70._4_4_ = uVar46;
      auVar70._0_4_ = uVar46;
      auVar70._8_4_ = uVar46;
      auVar70._12_4_ = uVar46;
      auVar70._16_4_ = uVar46;
      auVar70._20_4_ = uVar46;
      auVar70._24_4_ = uVar46;
      auVar70._28_4_ = uVar46;
      auVar70 = vfmadd213ps_avx512vl(auVar74,auVar53,auVar70);
      auVar53 = *(undefined1 (*) [32])ray;
      auVar54 = *(undefined1 (*) [32])(ray + 0x20);
      auVar55 = *(undefined1 (*) [32])(ray + 0x40);
      auVar56 = *(undefined1 (*) [32])(ray + 0x80);
      auVar57 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar58 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar59 = vsubps_avx(auVar62,auVar53);
      auVar60 = vsubps_avx(auVar63,auVar54);
      auVar63 = vsubps_avx512vl(auVar64,auVar55);
      auVar64 = vsubps_avx512vl(auVar65,auVar53);
      auVar65 = vsubps_avx512vl(auVar66,auVar54);
      auVar66 = vsubps_avx512vl(auVar67,auVar55);
      auVar68 = vsubps_avx512vl(auVar68,auVar53);
      auVar69 = vsubps_avx512vl(auVar69,auVar54);
      auVar55 = vsubps_avx512vl(auVar70,auVar55);
      auVar70 = vsubps_avx512vl(auVar68,auVar59);
      auVar67 = vsubps_avx512vl(auVar69,auVar60);
      auVar71 = vsubps_avx512vl(auVar55,auVar63);
      auVar72 = vsubps_avx512vl(auVar59,auVar64);
      in_ZMM14 = ZEXT3264(auVar72);
      auVar73 = vsubps_avx512vl(auVar60,auVar65);
      auVar74 = vsubps_avx512vl(auVar63,auVar66);
      in_ZMM15 = ZEXT3264(auVar74);
      auVar75 = vsubps_avx512vl(auVar64,auVar68);
      auVar76 = vsubps_avx512vl(auVar65,auVar69);
      auVar77 = vsubps_avx512vl(auVar66,auVar55);
      auVar54 = vaddps_avx512vl(auVar68,auVar59);
      auVar62 = vaddps_avx512vl(auVar69,auVar60);
      auVar53 = vaddps_avx512vl(auVar55,auVar63);
      auVar78 = vmulps_avx512vl(auVar62,auVar71);
      auVar78 = vfmsub231ps_avx512vl(auVar78,auVar67,auVar53);
      auVar53 = vmulps_avx512vl(auVar53,auVar70);
      auVar79 = vfmsub231ps_avx512vl(auVar53,auVar71,auVar54);
      auVar53._4_4_ = auVar54._4_4_ * auVar67._4_4_;
      auVar53._0_4_ = auVar54._0_4_ * auVar67._0_4_;
      auVar53._8_4_ = auVar54._8_4_ * auVar67._8_4_;
      auVar53._12_4_ = auVar54._12_4_ * auVar67._12_4_;
      auVar53._16_4_ = auVar54._16_4_ * auVar67._16_4_;
      auVar53._20_4_ = auVar54._20_4_ * auVar67._20_4_;
      auVar53._24_4_ = auVar54._24_4_ * auVar67._24_4_;
      auVar53._28_4_ = auVar54._28_4_;
      auVar83 = vfmsub231ps_fma(auVar53,auVar70,auVar62);
      fVar7 = auVar58._0_4_;
      auVar80._0_4_ = auVar83._0_4_ * fVar7;
      fVar8 = auVar58._4_4_;
      auVar80._4_4_ = auVar83._4_4_ * fVar8;
      fVar9 = auVar58._8_4_;
      auVar80._8_4_ = auVar83._8_4_ * fVar9;
      fVar10 = auVar58._12_4_;
      auVar80._12_4_ = auVar83._12_4_ * fVar10;
      fVar11 = auVar58._16_4_;
      auVar80._16_4_ = fVar11 * 0.0;
      fVar12 = auVar58._20_4_;
      auVar80._20_4_ = fVar12 * 0.0;
      fVar13 = auVar58._24_4_;
      auVar80._24_4_ = fVar13 * 0.0;
      auVar80._28_4_ = 0;
      auVar53 = vfmadd231ps_avx512vl(auVar80,auVar57,auVar79);
      auVar54 = vfmadd231ps_avx512vl(auVar53,auVar56,auVar78);
      auVar53 = vaddps_avx512vl(auVar59,auVar64);
      auVar62 = vaddps_avx512vl(auVar60,auVar65);
      auVar78 = vaddps_avx512vl(auVar63,auVar66);
      auVar79 = vmulps_avx512vl(auVar62,auVar74);
      auVar79 = vfmsub231ps_avx512vl(auVar79,auVar73,auVar78);
      auVar78 = vmulps_avx512vl(auVar78,auVar72);
      auVar78 = vfmsub231ps_avx512vl(auVar78,auVar74,auVar53);
      auVar53 = vmulps_avx512vl(auVar53,auVar73);
      auVar53 = vfmsub231ps_avx512vl(auVar53,auVar72,auVar62);
      auVar62._4_4_ = auVar53._4_4_ * fVar8;
      auVar62._0_4_ = auVar53._0_4_ * fVar7;
      auVar62._8_4_ = auVar53._8_4_ * fVar9;
      auVar62._12_4_ = auVar53._12_4_ * fVar10;
      auVar62._16_4_ = auVar53._16_4_ * fVar11;
      auVar62._20_4_ = auVar53._20_4_ * fVar12;
      auVar62._24_4_ = auVar53._24_4_ * fVar13;
      auVar62._28_4_ = auVar53._28_4_;
      auVar53 = vfmadd231ps_avx512vl(auVar62,auVar57,auVar78);
      auVar62 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar78 = vfmadd231ps_avx512vl(auVar53,auVar56,auVar79);
      in_ZMM13 = ZEXT3264(auVar78);
      auVar53 = vaddps_avx512vl(auVar64,auVar68);
      auVar68 = vaddps_avx512vl(auVar65,auVar69);
      auVar55 = vaddps_avx512vl(auVar66,auVar55);
      auVar69 = vmulps_avx512vl(auVar68,auVar77);
      auVar69 = vfmsub231ps_avx512vl(auVar69,auVar76,auVar55);
      auVar55 = vmulps_avx512vl(auVar55,auVar75);
      auVar55 = vfmsub231ps_avx512vl(auVar55,auVar77,auVar53);
      auVar53 = vmulps_avx512vl(auVar53,auVar76);
      auVar53 = vfmsub231ps_avx512vl(auVar53,auVar75,auVar68);
      auVar53 = vmulps_avx512vl(auVar53,auVar58);
      auVar53 = vfmadd231ps_avx512vl(auVar53,auVar57,auVar55);
      auVar53 = vfmadd231ps_avx512vl(auVar53,auVar56,auVar69);
      auVar55 = vaddps_avx512vl(auVar54,auVar78);
      auVar64 = vaddps_avx512vl(auVar53,auVar55);
      auVar65 = auVar95._0_32_;
      vandps_avx512vl(auVar64,auVar65);
      auVar55 = vmulps_avx512vl(auVar64,auVar100._0_32_);
      auVar68 = vminps_avx512vl(auVar54,auVar78);
      auVar68 = vminps_avx512vl(auVar68,auVar53);
      auVar69 = vxorps_avx512vl(auVar55,auVar62);
      uVar16 = vcmpps_avx512vl(auVar68,auVar69,5);
      auVar68 = vmaxps_avx512vl(auVar54,auVar78);
      auVar53 = vmaxps_avx512vl(auVar68,auVar53);
      uVar17 = vcmpps_avx512vl(auVar53,auVar55,2);
      local_2a80[0] = bVar39;
      bVar42 = ((byte)uVar16 | (byte)uVar17) & bVar39;
      auVar55 = auVar96._0_32_;
      if (bVar42 == 0) {
LAB_01f4a64d:
        auVar64 = auVar53;
        bVar42 = 0;
        auVar76 = local_2820;
        auVar77 = local_2800;
        auVar79 = local_27e0;
        auVar56 = local_27c0;
        auVar57 = local_27a0;
        auVar58 = _local_2780;
        auVar54 = _local_2760;
      }
      else {
        auVar53 = vmulps_avx512vl(auVar73,auVar71);
        auVar68 = vmulps_avx512vl(auVar70,auVar74);
        auVar69 = vmulps_avx512vl(auVar72,auVar67);
        auVar66 = vmulps_avx512vl(auVar76,auVar74);
        auVar79 = vmulps_avx512vl(auVar72,auVar77);
        auVar80 = vmulps_avx512vl(auVar75,auVar73);
        auVar67 = vfmsub213ps_avx512vl(auVar67,auVar74,auVar53);
        auVar71 = vfmsub213ps_avx512vl(auVar71,auVar72,auVar68);
        auVar70 = vfmsub213ps_avx512vl(auVar70,auVar73,auVar69);
        auVar73 = vfmsub213ps_avx512vl(auVar77,auVar73,auVar66);
        auVar74 = vfmsub213ps_avx512vl(auVar75,auVar74,auVar79);
        auVar72 = vfmsub213ps_avx512vl(auVar76,auVar72,auVar80);
        vandps_avx512vl(auVar53,auVar65);
        vandps_avx512vl(auVar66,auVar65);
        uVar14 = vcmpps_avx512vl(auVar72,auVar72,1);
        vandps_avx512vl(auVar68,auVar65);
        vandps_avx512vl(auVar79,auVar65);
        uVar15 = vcmpps_avx512vl(auVar72,auVar72,1);
        vandps_avx512vl(auVar69,auVar65);
        in_ZMM14 = ZEXT3264(auVar72);
        vandps_avx512vl(auVar80,auVar65);
        in_ZMM15 = ZEXT3264(auVar72);
        uVar18 = vcmpps_avx512vl(auVar72,auVar72,1);
        bVar50 = (bool)((byte)uVar14 & 1);
        auVar79._0_4_ = (uint)bVar50 * auVar67._0_4_ | (uint)!bVar50 * auVar73._0_4_;
        bVar50 = (bool)((byte)(uVar14 >> 1) & 1);
        auVar79._4_4_ = (uint)bVar50 * auVar67._4_4_ | (uint)!bVar50 * auVar73._4_4_;
        bVar50 = (bool)((byte)(uVar14 >> 2) & 1);
        auVar79._8_4_ = (uint)bVar50 * auVar67._8_4_ | (uint)!bVar50 * auVar73._8_4_;
        bVar50 = (bool)((byte)(uVar14 >> 3) & 1);
        auVar79._12_4_ = (uint)bVar50 * auVar67._12_4_ | (uint)!bVar50 * auVar73._12_4_;
        bVar50 = (bool)((byte)(uVar14 >> 4) & 1);
        auVar79._16_4_ = (uint)bVar50 * auVar67._16_4_ | (uint)!bVar50 * auVar73._16_4_;
        bVar50 = (bool)((byte)(uVar14 >> 5) & 1);
        auVar79._20_4_ = (uint)bVar50 * auVar67._20_4_ | (uint)!bVar50 * auVar73._20_4_;
        bVar50 = (bool)((byte)(uVar14 >> 6) & 1);
        auVar79._24_4_ = (uint)bVar50 * auVar67._24_4_ | (uint)!bVar50 * auVar73._24_4_;
        bVar50 = SUB81(uVar14 >> 7,0);
        auVar79._28_4_ = (uint)bVar50 * auVar67._28_4_ | (uint)!bVar50 * auVar73._28_4_;
        bVar50 = (bool)((byte)uVar15 & 1);
        auVar77._0_4_ = (uint)bVar50 * auVar71._0_4_ | (uint)!bVar50 * auVar74._0_4_;
        bVar50 = (bool)((byte)(uVar15 >> 1) & 1);
        auVar77._4_4_ = (uint)bVar50 * auVar71._4_4_ | (uint)!bVar50 * auVar74._4_4_;
        bVar50 = (bool)((byte)(uVar15 >> 2) & 1);
        auVar77._8_4_ = (uint)bVar50 * auVar71._8_4_ | (uint)!bVar50 * auVar74._8_4_;
        bVar50 = (bool)((byte)(uVar15 >> 3) & 1);
        auVar77._12_4_ = (uint)bVar50 * auVar71._12_4_ | (uint)!bVar50 * auVar74._12_4_;
        bVar50 = (bool)((byte)(uVar15 >> 4) & 1);
        auVar77._16_4_ = (uint)bVar50 * auVar71._16_4_ | (uint)!bVar50 * auVar74._16_4_;
        bVar50 = (bool)((byte)(uVar15 >> 5) & 1);
        auVar77._20_4_ = (uint)bVar50 * auVar71._20_4_ | (uint)!bVar50 * auVar74._20_4_;
        bVar50 = (bool)((byte)(uVar15 >> 6) & 1);
        auVar77._24_4_ = (uint)bVar50 * auVar71._24_4_ | (uint)!bVar50 * auVar74._24_4_;
        bVar50 = SUB81(uVar15 >> 7,0);
        auVar77._28_4_ = (uint)bVar50 * auVar71._28_4_ | (uint)!bVar50 * auVar74._28_4_;
        bVar50 = (bool)((byte)uVar18 & 1);
        auVar76._0_4_ = (float)((uint)bVar50 * auVar70._0_4_ | (uint)!bVar50 * auVar72._0_4_);
        bVar50 = (bool)((byte)(uVar18 >> 1) & 1);
        auVar76._4_4_ = (float)((uint)bVar50 * auVar70._4_4_ | (uint)!bVar50 * auVar72._4_4_);
        bVar50 = (bool)((byte)(uVar18 >> 2) & 1);
        auVar76._8_4_ = (float)((uint)bVar50 * auVar70._8_4_ | (uint)!bVar50 * auVar72._8_4_);
        bVar50 = (bool)((byte)(uVar18 >> 3) & 1);
        auVar76._12_4_ = (float)((uint)bVar50 * auVar70._12_4_ | (uint)!bVar50 * auVar72._12_4_);
        bVar50 = (bool)((byte)(uVar18 >> 4) & 1);
        auVar76._16_4_ = (float)((uint)bVar50 * auVar70._16_4_ | (uint)!bVar50 * auVar72._16_4_);
        bVar50 = (bool)((byte)(uVar18 >> 5) & 1);
        auVar76._20_4_ = (float)((uint)bVar50 * auVar70._20_4_ | (uint)!bVar50 * auVar72._20_4_);
        bVar50 = (bool)((byte)(uVar18 >> 6) & 1);
        auVar76._24_4_ = (float)((uint)bVar50 * auVar70._24_4_ | (uint)!bVar50 * auVar72._24_4_);
        bVar50 = SUB81(uVar18 >> 7,0);
        auVar76._28_4_ = (uint)bVar50 * auVar70._28_4_ | (uint)!bVar50 * auVar72._28_4_;
        auVar75._4_4_ = fVar8 * auVar76._4_4_;
        auVar75._0_4_ = fVar7 * auVar76._0_4_;
        auVar75._8_4_ = fVar9 * auVar76._8_4_;
        auVar75._12_4_ = fVar10 * auVar76._12_4_;
        auVar75._16_4_ = fVar11 * auVar76._16_4_;
        auVar75._20_4_ = fVar12 * auVar76._20_4_;
        auVar75._24_4_ = fVar13 * auVar76._24_4_;
        auVar75._28_4_ = auVar58._28_4_;
        auVar83 = vfmadd213ps_fma(auVar57,auVar77,auVar75);
        auVar83 = vfmadd213ps_fma(auVar56,auVar79,ZEXT1632(auVar83));
        auVar58 = ZEXT1632(CONCAT412(auVar83._12_4_ + auVar83._12_4_,
                                     CONCAT48(auVar83._8_4_ + auVar83._8_4_,
                                              CONCAT44(auVar83._4_4_ + auVar83._4_4_,
                                                       auVar83._0_4_ + auVar83._0_4_))));
        auVar88._0_4_ = auVar63._0_4_ * auVar76._0_4_;
        auVar88._4_4_ = auVar63._4_4_ * auVar76._4_4_;
        auVar88._8_4_ = auVar63._8_4_ * auVar76._8_4_;
        auVar88._12_4_ = auVar63._12_4_ * auVar76._12_4_;
        auVar88._16_4_ = auVar63._16_4_ * auVar76._16_4_;
        auVar88._20_4_ = auVar63._20_4_ * auVar76._20_4_;
        auVar88._24_4_ = auVar63._24_4_ * auVar76._24_4_;
        auVar88._28_4_ = 0;
        auVar83 = vfmadd213ps_fma(auVar60,auVar77,auVar88);
        auVar20 = vfmadd213ps_fma(auVar59,auVar79,ZEXT1632(auVar83));
        auVar56 = vrcp14ps_avx512vl(auVar58);
        auVar57 = vxorps_avx512vl(auVar58,auVar62);
        auVar53 = vfnmadd213ps_avx512vl(auVar56,auVar58,auVar55);
        auVar83 = vfmadd132ps_fma(auVar53,auVar56,auVar56);
        auVar56 = ZEXT1632(CONCAT412((auVar20._12_4_ + auVar20._12_4_) * auVar83._12_4_,
                                     CONCAT48((auVar20._8_4_ + auVar20._8_4_) * auVar83._8_4_,
                                              CONCAT44((auVar20._4_4_ + auVar20._4_4_) *
                                                       auVar83._4_4_,
                                                       (auVar20._0_4_ + auVar20._0_4_) *
                                                       auVar83._0_4_))));
        uVar16 = vcmpps_avx512vl(auVar56,*(undefined1 (*) [32])(ray + 0x100),2);
        uVar17 = vcmpps_avx512vl(auVar56,*(undefined1 (*) [32])(ray + 0x60),0xd);
        uVar19 = vcmpps_avx512vl(auVar58,auVar57,4);
        bVar42 = bVar42 & (byte)uVar16 & (byte)uVar17 & (byte)uVar19;
        auVar57 = auVar64;
        auVar58 = auVar78;
        if (bVar42 == 0) goto LAB_01f4a64d;
      }
      _local_2760 = auVar54;
      _local_2780 = auVar58;
      local_27a0 = auVar57;
      local_27c0 = auVar56;
      local_27e0 = auVar79;
      local_2800 = auVar77;
      local_2820 = auVar76;
      local_2ac0 = (context->scene->geometries).items[uVar52].ptr;
      uVar48 = local_2ac0->mask;
      auVar82._4_4_ = uVar48;
      auVar82._0_4_ = uVar48;
      auVar82._8_4_ = uVar48;
      auVar82._12_4_ = uVar48;
      auVar82._16_4_ = uVar48;
      auVar82._20_4_ = uVar48;
      auVar82._24_4_ = uVar48;
      auVar82._28_4_ = uVar48;
      uVar16 = vptestmd_avx512vl(auVar82,*(undefined1 (*) [32])(ray + 0x120));
      bVar42 = (byte)uVar16 & bVar42;
      if (bVar42 != 0) {
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (local_2ac0->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          vandps_avx512vl(local_27a0,auVar65);
          auVar29._8_4_ = 0x219392ef;
          auVar29._0_8_ = 0x219392ef219392ef;
          auVar29._12_4_ = 0x219392ef;
          auVar29._16_4_ = 0x219392ef;
          auVar29._20_4_ = 0x219392ef;
          auVar29._24_4_ = 0x219392ef;
          auVar29._28_4_ = 0x219392ef;
          uVar52 = vcmpps_avx512vl(auVar64,auVar29,5);
          auVar53 = vrcp14ps_avx512vl(local_27a0);
          auVar54 = vfnmadd213ps_avx512vl(auVar53,local_27a0,auVar55);
          auVar54 = vfmadd132ps_avx512vl(auVar54,auVar53,auVar53);
          fVar7 = (float)((uint)((byte)uVar52 & 1) * auVar54._0_4_);
          fVar13 = (float)((uint)((byte)(uVar52 >> 1) & 1) * auVar54._4_4_);
          fVar12 = (float)((uint)((byte)(uVar52 >> 2) & 1) * auVar54._8_4_);
          fVar11 = (float)((uint)((byte)(uVar52 >> 3) & 1) * auVar54._12_4_);
          fVar10 = (float)((uint)((byte)(uVar52 >> 4) & 1) * auVar54._16_4_);
          fVar9 = (float)((uint)((byte)(uVar52 >> 5) & 1) * auVar54._20_4_);
          fVar8 = (float)((uint)((byte)(uVar52 >> 6) & 1) * auVar54._24_4_);
          auVar33._4_4_ = fVar13 * (float)local_2760._4_4_;
          auVar33._0_4_ = fVar7 * (float)local_2760._0_4_;
          auVar33._8_4_ = fVar12 * fStack_2758;
          auVar33._12_4_ = fVar11 * fStack_2754;
          auVar33._16_4_ = fVar10 * fStack_2750;
          auVar33._20_4_ = fVar9 * fStack_274c;
          auVar33._24_4_ = fVar8 * fStack_2748;
          auVar33._28_4_ = auVar53._28_4_;
          local_26e0 = vminps_avx512vl(auVar33,auVar55);
          auVar34._4_4_ = fVar13 * (float)local_2780._4_4_;
          auVar34._0_4_ = fVar7 * (float)local_2780._0_4_;
          auVar34._8_4_ = fVar12 * fStack_2778;
          auVar34._12_4_ = fVar11 * fStack_2774;
          auVar34._16_4_ = fVar10 * fStack_2770;
          auVar34._20_4_ = fVar9 * fStack_276c;
          auVar34._24_4_ = fVar8 * fStack_2768;
          auVar34._28_4_ = (uint)(byte)(uVar52 >> 7) * auVar54._28_4_;
          local_26c0 = vminps_avx512vl(auVar34,auVar55);
          local_2680 = vpbroadcastd_avx512vl();
          local_26a0 = vpbroadcastd_avx512vl();
          local_2740 = local_27e0._0_8_;
          uStack_2738 = local_27e0._8_8_;
          uStack_2730 = local_27e0._16_8_;
          uStack_2728 = local_27e0._24_8_;
          local_2720 = local_2800._0_8_;
          uStack_2718 = local_2800._8_8_;
          uStack_2710 = local_2800._16_8_;
          uStack_2708 = local_2800._24_8_;
          local_2700 = local_2820;
          vpcmpeqd_avx2(local_26e0,local_26e0);
          uStack_265c = context->user->instID[0];
          local_2660 = uStack_265c;
          uStack_2658 = uStack_265c;
          uStack_2654 = uStack_265c;
          uStack_2650 = uStack_265c;
          uStack_264c = uStack_265c;
          uStack_2648 = uStack_265c;
          uStack_2644 = uStack_265c;
          uStack_263c = context->user->instPrimID[0];
          local_2640 = uStack_263c;
          uStack_2638 = uStack_263c;
          uStack_2634 = uStack_263c;
          uStack_2630 = uStack_263c;
          uStack_262c = uStack_263c;
          uStack_2628 = uStack_263c;
          uStack_2624 = uStack_263c;
          local_2a00 = *(undefined1 (*) [32])(ray + 0x100);
          auVar53 = vblendmps_avx512vl(local_2a00,local_27c0);
          bVar50 = (bool)(bVar42 >> 1 & 1);
          bVar2 = (bool)(bVar42 >> 2 & 1);
          bVar3 = (bool)(bVar42 >> 3 & 1);
          bVar4 = (bool)(bVar42 >> 4 & 1);
          bVar5 = (bool)(bVar42 >> 5 & 1);
          bVar6 = (bool)(bVar42 >> 6 & 1);
          *(uint *)(ray + 0x100) =
               (uint)(bVar42 & 1) * auVar53._0_4_ | !(bool)(bVar42 & 1) * uStack_263c;
          *(uint *)(ray + 0x104) = (uint)bVar50 * auVar53._4_4_ | !bVar50 * uStack_263c;
          *(uint *)(ray + 0x108) = (uint)bVar2 * auVar53._8_4_ | !bVar2 * uStack_263c;
          *(uint *)(ray + 0x10c) = (uint)bVar3 * auVar53._12_4_ | !bVar3 * uStack_263c;
          *(uint *)(ray + 0x110) = (uint)bVar4 * auVar53._16_4_ | !bVar4 * uStack_263c;
          *(uint *)(ray + 0x114) = (uint)bVar5 * auVar53._20_4_ | !bVar5 * uStack_263c;
          *(uint *)(ray + 0x118) = (uint)bVar6 * auVar53._24_4_ | !bVar6 * uStack_263c;
          *(uint *)(ray + 0x11c) =
               (uint)(bVar42 >> 7) * auVar53._28_4_ | !(bool)(bVar42 >> 7) * uStack_263c;
          local_2a20 = vpmovm2d_avx512vl((ulong)bVar42);
          local_2a50.valid = (int *)local_2a20;
          local_2a50.geometryUserPtr = local_2ac0->userPtr;
          local_2a50.context = context->user;
          local_2a50.hit = (RTCHitN *)&local_2740;
          local_2a50.N = 8;
          local_2a50.ray = (RTCRayN *)ray;
          if (local_2ac0->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            in_ZMM13 = ZEXT1664(auVar78._0_16_);
            in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
            in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
            (*local_2ac0->occlusionFilterN)(&local_2a50);
            auVar53 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
            auVar100 = ZEXT3264(auVar53);
            auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
            auVar99 = ZEXT3264(auVar53);
            auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
            auVar98 = ZEXT3264(auVar53);
            auVar53 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar97 = ZEXT3264(auVar53);
            auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar96 = ZEXT3264(auVar53);
            auVar53 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar95 = ZEXT3264(auVar53);
            uVar51 = local_2ab8;
            context = local_2ab0;
          }
          if (local_2a20 == (undefined1  [32])0x0) {
            uVar52 = 0;
          }
          else {
            p_Var1 = context->args->filter;
            if ((p_Var1 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((local_2ac0->field_8).field_0x2 & 0x40) != 0))))
            {
              in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
              in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
              in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
              (*p_Var1)(&local_2a50);
              auVar53 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
              auVar100 = ZEXT3264(auVar53);
              auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
              auVar99 = ZEXT3264(auVar53);
              auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
              auVar98 = ZEXT3264(auVar53);
              auVar53 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar97 = ZEXT3264(auVar53);
              auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar96 = ZEXT3264(auVar53);
              auVar53 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar95 = ZEXT3264(auVar53);
              uVar51 = local_2ab8;
              context = local_2ab0;
            }
            uVar52 = vptestmd_avx512vl(local_2a20,local_2a20);
            auVar53 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            bVar50 = (bool)((byte)uVar52 & 1);
            auVar78._0_4_ =
                 (uint)bVar50 * auVar53._0_4_ | (uint)!bVar50 * *(int *)(local_2a50.ray + 0x100);
            bVar50 = (bool)((byte)(uVar52 >> 1) & 1);
            auVar78._4_4_ =
                 (uint)bVar50 * auVar53._4_4_ | (uint)!bVar50 * *(int *)(local_2a50.ray + 0x104);
            bVar50 = (bool)((byte)(uVar52 >> 2) & 1);
            auVar78._8_4_ =
                 (uint)bVar50 * auVar53._8_4_ | (uint)!bVar50 * *(int *)(local_2a50.ray + 0x108);
            bVar50 = (bool)((byte)(uVar52 >> 3) & 1);
            auVar78._12_4_ =
                 (uint)bVar50 * auVar53._12_4_ | (uint)!bVar50 * *(int *)(local_2a50.ray + 0x10c);
            bVar50 = (bool)((byte)(uVar52 >> 4) & 1);
            auVar78._16_4_ =
                 (uint)bVar50 * auVar53._16_4_ | (uint)!bVar50 * *(int *)(local_2a50.ray + 0x110);
            bVar50 = (bool)((byte)(uVar52 >> 5) & 1);
            auVar78._20_4_ =
                 (uint)bVar50 * auVar53._20_4_ | (uint)!bVar50 * *(int *)(local_2a50.ray + 0x114);
            bVar50 = (bool)((byte)(uVar52 >> 6) & 1);
            auVar78._24_4_ =
                 (uint)bVar50 * auVar53._24_4_ | (uint)!bVar50 * *(int *)(local_2a50.ray + 0x118);
            bVar50 = SUB81(uVar52 >> 7,0);
            auVar78._28_4_ =
                 (uint)bVar50 * auVar53._28_4_ | (uint)!bVar50 * *(int *)(local_2a50.ray + 0x11c);
            *(undefined1 (*) [32])(local_2a50.ray + 0x100) = auVar78;
          }
          bVar42 = (byte)uVar52;
          auVar81._0_4_ =
               (uint)(bVar42 & 1) * *(int *)local_2aa0 |
               (uint)!(bool)(bVar42 & 1) * local_2a00._0_4_;
          bVar50 = (bool)((byte)(uVar52 >> 1) & 1);
          auVar81._4_4_ = (uint)bVar50 * *(int *)(local_2aa0 + 4) | (uint)!bVar50 * local_2a00._4_4_
          ;
          bVar50 = (bool)((byte)(uVar52 >> 2) & 1);
          auVar81._8_4_ = (uint)bVar50 * *(int *)(local_2aa0 + 8) | (uint)!bVar50 * local_2a00._8_4_
          ;
          bVar50 = (bool)((byte)(uVar52 >> 3) & 1);
          auVar81._12_4_ =
               (uint)bVar50 * *(int *)(local_2aa0 + 0xc) | (uint)!bVar50 * local_2a00._12_4_;
          bVar50 = (bool)((byte)(uVar52 >> 4) & 1);
          auVar81._16_4_ =
               (uint)bVar50 * *(int *)(local_2aa0 + 0x10) | (uint)!bVar50 * local_2a00._16_4_;
          bVar50 = (bool)((byte)(uVar52 >> 5) & 1);
          auVar81._20_4_ =
               (uint)bVar50 * *(int *)(local_2aa0 + 0x14) | (uint)!bVar50 * local_2a00._20_4_;
          bVar50 = (bool)((byte)(uVar52 >> 6) & 1);
          auVar81._24_4_ =
               (uint)bVar50 * *(int *)(local_2aa0 + 0x18) | (uint)!bVar50 * local_2a00._24_4_;
          bVar50 = (bool)((byte)(uVar52 >> 7) & 1);
          auVar81._28_4_ =
               (uint)bVar50 * *(int *)(local_2aa0 + 0x1c) | (uint)!bVar50 * local_2a00._28_4_;
          *(undefined1 (*) [32])local_2aa0 = auVar81;
        }
        bVar39 = local_2a80[0] & ~bVar42;
      }
      if ((bVar39 == 0) || (bVar50 = 2 < uVar47, uVar47 = uVar47 + 1, bVar50)) break;
    }
    bVar38 = bVar38 & bVar39;
    if (bVar38 == 0) break;
  }
  bVar38 = ~bVar38;
LAB_01f4a96b:
  bVar45 = bVar45 | bVar38;
  if (bVar45 == 0xff) {
    bVar45 = 0xff;
    goto LAB_01f4aaa5;
  }
  auVar53 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  local_2840._0_4_ =
       (uint)(bVar45 & 1) * auVar53._0_4_ | (uint)!(bool)(bVar45 & 1) * local_2840._0_4_;
  bVar50 = (bool)(bVar45 >> 1 & 1);
  local_2840._4_4_ = (uint)bVar50 * auVar53._4_4_ | (uint)!bVar50 * local_2840._4_4_;
  bVar50 = (bool)(bVar45 >> 2 & 1);
  local_2840._8_4_ = (uint)bVar50 * auVar53._8_4_ | (uint)!bVar50 * local_2840._8_4_;
  bVar50 = (bool)(bVar45 >> 3 & 1);
  local_2840._12_4_ = (uint)bVar50 * auVar53._12_4_ | (uint)!bVar50 * local_2840._12_4_;
  bVar50 = (bool)(bVar45 >> 4 & 1);
  local_2840._16_4_ = (uint)bVar50 * auVar53._16_4_ | (uint)!bVar50 * local_2840._16_4_;
  bVar50 = (bool)(bVar45 >> 5 & 1);
  local_2840._20_4_ = (uint)bVar50 * auVar53._20_4_ | (uint)!bVar50 * local_2840._20_4_;
  bVar50 = (bool)(bVar45 >> 6 & 1);
  local_2840._24_4_ = (uint)bVar50 * auVar53._24_4_ | (uint)!bVar50 * local_2840._24_4_;
  local_2840._28_4_ =
       (uint)(bVar45 >> 7) * auVar53._28_4_ | (uint)!(bool)(bVar45 >> 7) * local_2840._28_4_;
  goto LAB_01f49f6b;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }